

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::type_to_array_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t variable_id)

{
  bool bVar1;
  SPIRVariable *var;
  SPIRType *type_00;
  char (*in_R8) [2];
  char local_24 [4];
  
  if ((ControlPointArray < type->basetype) ||
     ((0x300800U >> (type->basetype & (Image|Struct)) & 1) == 0)) {
    bVar1 = Compiler::type_is_array_of_pointers((Compiler *)this,type);
    if ((!bVar1) &&
       (((this->msl_options).force_native_arrays == false &&
        ((this->is_using_builtin_array & 1U) == 0)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    if (variable_id != 0) {
      var = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + variable_id);
      if ((var->storage == StorageClassStorageBuffer) || (var->storage == StorageClassUniform)) {
        type_00 = Compiler::get_variable_data_type((Compiler *)this,var);
        bVar1 = Compiler::is_array((Compiler *)this,type_00);
        if (bVar1) {
          get_resource_array_size(this,type,variable_id);
          join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                    (__return_storage_ptr__,(spirv_cross *)0x2e4336,(char (*) [2])local_24,
                     (uint *)0x2ef80f,in_R8);
          return __return_storage_ptr__;
        }
      }
    }
  }
  CompilerGLSL::type_to_array_glsl_abi_cxx11_
            (__return_storage_ptr__,&this->super_CompilerGLSL,type,variable_id);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::type_to_array_glsl(const SPIRType &type, uint32_t variable_id)
{
	// Allow Metal to use the array<T> template to make arrays a value type
	switch (type.basetype)
	{
	case SPIRType::AtomicCounter:
	case SPIRType::ControlPointArray:
	case SPIRType::RayQuery:
		return CompilerGLSL::type_to_array_glsl(type, variable_id);

	default:
		if (type_is_array_of_pointers(type) || using_builtin_array())
		{
			const SPIRVariable *var = variable_id ? &get<SPIRVariable>(variable_id) : nullptr;
			if (var && (var->storage == StorageClassUniform || var->storage == StorageClassStorageBuffer) &&
			    is_array(get_variable_data_type(*var)))
			{
				return join("[", get_resource_array_size(type, variable_id), "]");
			}
			else
				return CompilerGLSL::type_to_array_glsl(type, variable_id);
		}
		else
			return "";
	}
}